

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

bool embree::extend_grid(RTCGeometry geom,vector<bool,_std::allocator<bool>_> *visited,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *left,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *top,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *right)

{
  ulong *puVar1;
  _Map_pointer ppuVar2;
  uint uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  _Map_pointer ppuVar9;
  uint *puVar10;
  ulong uVar11;
  _Elt_pointer puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  RTCGeometry pRVar19;
  uint next_edge;
  uint local_5c;
  RTCGeometry local_58;
  ulong local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  deque<unsigned_int,std::allocator<unsigned_int>> *local_40;
  deque<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  lVar17 = 0;
  local_50 = 0;
  uVar7 = 0xffffffff;
  local_58 = geom;
  local_48 = visited;
  local_40 = (deque<unsigned_int,std::allocator<unsigned_int>> *)right;
  local_38 = (deque<unsigned_int,std::allocator<unsigned_int>> *)left;
  while( true ) {
    ppuVar2 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppuVar9 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    uVar13 = (ulong)((long)ppuVar2 - (long)ppuVar9) >> 3;
    lVar15 = (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 2;
    puVar12 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar16 = (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_last - (long)puVar12 >> 2;
    uVar18 = ((uVar13 - 1) + (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x80 + lVar15 + lVar16;
    if (uVar18 <= local_50) break;
    uVar13 = ((long)puVar12 -
              (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 2) + local_50;
    if ((long)uVar13 < 0) {
      uVar11 = (long)uVar13 >> 7;
LAB_0014fa4d:
      puVar10 = ppuVar9[uVar11] + uVar13 + uVar11 * -0x80;
    }
    else {
      if (0x7f < uVar13) {
        uVar11 = uVar13 >> 7;
        goto LAB_0014fa4d;
      }
      puVar10 = (uint *)((long)puVar12 + lVar17);
    }
    uVar8 = *puVar10;
    uVar3 = rtcGetGeometryOppositeHalfEdge(local_58,0,uVar8);
    if ((uVar3 == uVar8) ||
       (uVar13 = rtcGetGeometryFace(local_58,uVar3), pRVar19 = local_58,
       ((local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6 & 0x3ffffff] >> (uVar13 & 0x3f) & 1) != 0
       )) goto LAB_0014fcef;
    if (local_50 != 0) {
      uVar4 = rtcGetGeometryPreviousHalfEdge(local_58,uVar7);
      iVar5 = rtcGetGeometryOppositeHalfEdge(pRVar19,0,uVar4);
      iVar6 = rtcGetGeometryNextHalfEdge(pRVar19,uVar3);
      if (iVar5 != iVar6) goto LAB_0014fcef;
    }
    local_50 = local_50 + 1;
    lVar17 = lVar17 + 4;
    uVar7 = uVar3;
  }
  if (((uVar13 - 1) + (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x80 + lVar15 + lVar16 != 0) {
    lVar17 = 0;
    uVar13 = 0;
    do {
      pRVar19 = local_58;
      uVar11 = ((long)puVar12 -
                (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Deque_impl_data._M_start._M_first >> 2) + uVar13;
      if ((long)uVar11 < 0) {
        uVar14 = (long)uVar11 >> 7;
LAB_0014fb48:
        puVar10 = ppuVar9[uVar14] + uVar11 + uVar14 * -0x80;
      }
      else {
        if (0x7f < uVar11) {
          uVar14 = uVar11 >> 7;
          goto LAB_0014fb48;
        }
        puVar10 = (uint *)((long)puVar12 + lVar17);
      }
      uVar7 = rtcGetGeometryOppositeHalfEdge(local_58,0,*puVar10);
      uVar8 = rtcGetGeometryFace(pRVar19,uVar7);
      puVar1 = (local_48->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar8 >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)uVar8 & 0x3f);
      local_5c = uVar7;
      local_5c = rtcGetGeometryNextHalfEdge(pRVar19,uVar7);
      if (uVar13 == 0) {
        if (*(uint **)(local_40 + 0x30) == (uint *)(*(long *)(local_40 + 0x40) + -4)) {
          std::deque<unsigned_int,std::allocator<unsigned_int>>::
          _M_push_back_aux<unsigned_int_const&>(local_40,&local_5c);
          pRVar19 = local_58;
        }
        else {
          **(uint **)(local_40 + 0x30) = local_5c;
          *(long *)(local_40 + 0x30) = *(long *)(local_40 + 0x30) + 4;
          pRVar19 = local_58;
        }
      }
      local_5c = rtcGetGeometryNextHalfEdge(pRVar19,local_5c);
      puVar12 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      uVar11 = ((long)puVar12 -
                (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Deque_impl_data._M_start._M_first >> 2) + uVar13;
      if ((long)uVar11 < 0) {
        uVar14 = (long)uVar11 >> 7;
LAB_0014fc18:
        puVar10 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar14] + uVar11 + uVar14 * -0x80;
      }
      else {
        if (0x7f < uVar11) {
          uVar14 = uVar11 >> 7;
          goto LAB_0014fc18;
        }
        puVar10 = (uint *)((long)puVar12 + lVar17);
      }
      *puVar10 = local_5c;
      local_5c = rtcGetGeometryNextHalfEdge(pRVar19,local_5c);
      ppuVar2 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (uVar13 == (((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                     ((((ulong)((long)ppuVar2 -
                               (long)(top->
                                     super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x80 +
                    ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_last -
                     (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur >> 2)) - 1) {
        if (*(long *)(local_38 + 0x10) == *(long *)(local_38 + 0x18)) {
          std::deque<unsigned_int,std::allocator<unsigned_int>>::
          _M_push_front_aux<unsigned_int_const&>(local_38,&local_5c);
        }
        else {
          *(uint *)(*(long *)(local_38 + 0x10) + -4) = local_5c;
          *(long *)(local_38 + 0x10) = *(long *)(local_38 + 0x10) + -4;
        }
      }
      uVar13 = uVar13 + 1;
      ppuVar2 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      ppuVar9 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Deque_impl_data._M_start._M_node;
      puVar12 = (top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      lVar17 = lVar17 + 4;
    } while (uVar13 < ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Deque_impl_data._M_start._M_last - (long)puVar12 >> 2) +
                      ((long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(top->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                      ((((ulong)((long)ppuVar2 - (long)ppuVar9) >> 3) - 1) +
                      (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x80);
  }
LAB_0014fcef:
  return uVar18 <= local_50;
}

Assistant:

bool extend_grid(RTCGeometry geom, std::vector<bool>& visited, std::deque<unsigned int>& left, std::deque<unsigned int>& top, std::deque<unsigned int>& right)
  {
    //        top
    // | <----------
    // |            /\ .
    // | left        | right 
    // |             |
    // \/            |

    
    /* test if all neighboring faces of top exist and are properly connected */
    unsigned int prev_opposite_edge = -1;
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      if (opposite_edge == edge) return false;
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      if (visited[opposite_face]) return false;

      /* test if we share an edge with the last quad */
      if (i > 0) {
        const unsigned int border0 = rtcGetGeometryOppositeHalfEdge(geom,0,rtcGetGeometryPreviousHalfEdge(geom,prev_opposite_edge));
        const unsigned int border1 = rtcGetGeometryNextHalfEdge(geom,opposite_edge);
        if (border0 != border1) return false;
      }
      prev_opposite_edge = opposite_edge;
    }

    /* extend border edges */
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      assert(opposite_edge != edge);
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      assert(!visited[opposite_face]);
      visited[opposite_face] = true;
      unsigned int next_edge = opposite_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == 0) right.push_back(next_edge);
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      top[i] = next_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == top.size()-1) left.push_front(next_edge);
    }

    return true;
  }